

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_cubic.hpp
# Opt level: O0

bool __thiscall
sisl::cartesian_cubic<float>::dump_to_stream(cartesian_cubic<float> *this,ofstream *stream)

{
  ulong uVar1;
  bool bVar2;
  undefined4 local_24;
  ofstream *poStack_20;
  uint sig;
  ofstream *stream_local;
  cartesian_cubic<float> *this_local;
  
  local_24 = 0x43434c5f;
  poStack_20 = stream;
  stream_local = (ofstream *)this;
  uVar1 = std::ios::good();
  bVar2 = (uVar1 & 1) != 0;
  if (bVar2) {
    std::ostream::write((char *)poStack_20,(long)&local_24);
    std::ostream::write((char *)poStack_20,(long)&this->_nx);
    std::ostream::write((char *)poStack_20,(long)&this->_ny);
    std::ostream::write((char *)poStack_20,(long)&this->_nz);
    array_n<float,_3,_std::allocator<float>_>::dump_to_stream(&this->_array,poStack_20);
  }
  return bVar2;
}

Assistant:

virtual bool dump_to_stream(std::ofstream &stream) const {
            unsigned int sig = 'CCL_';

            if(!stream.good()) return false;

            stream.write((char *)&sig, sizeof(unsigned int));
            stream.write((char *)&_nx, sizeof(unsigned int));
            stream.write((char *)&_ny, sizeof(unsigned int));
            stream.write((char *)&_nz, sizeof(unsigned int));

            _array.dump_to_stream(stream);
            return true;
        }